

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_buffer.h
# Opt level: O0

int __thiscall
PenguinV_Image::ImageTemplate<long>::copy
          (ImageTemplate<long> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined8 uVar1;
  long *plVar2;
  EVP_PKEY_CTX *extraout_RAX;
  imageException *unaff_retaddr;
  size_t in_stack_ffffffffffffffc8;
  ImageTemplate<long> *in_stack_ffffffffffffffd0;
  ImageTemplate<long> *in_stack_ffffffffffffffe0;
  
  if ((EVP_PKEY_CTX)this->_type != dst[0x20]) {
    uVar1 = __cxa_allocate_exception(0x28);
    imageException::imageException(unaff_retaddr,(char *)this);
    __cxa_throw(uVar1,&imageException::typeinfo,imageException::~imageException);
  }
  clear(in_stack_ffffffffffffffd0);
  this->_width = *(uint32_t *)(dst + 8);
  this->_height = *(uint32_t *)(dst + 0xc);
  this->_colorCount = (uint8_t)dst[0x10];
  this->_rowSize = *(uint32_t *)(dst + 0x14);
  this->_alignment = (uint8_t)dst[0x11];
  if (*(long *)(dst + 0x18) != 0) {
    plVar2 = _allocate(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    this->_data = plVar2;
    _copy(in_stack_ffffffffffffffe0,(long *)this,(long *)in_stack_ffffffffffffffd0,
          in_stack_ffffffffffffffc8);
    dst = extraout_RAX;
  }
  return (int)dst;
}

Assistant:

void copy( const ImageTemplate & image )
        {
            if( _type != image._type )
                throw imageException( "Cannot copy image of one type to another type." );

            clear();

            _width  = image._width;
            _height = image._height;

            _colorCount = image._colorCount;
            _rowSize    = image._rowSize;
            _alignment  = image._alignment;

            if( image._data != nullptr ) {
                _data = _allocate( _height * _rowSize );

                _copy( _data, image._data, sizeof( TColorDepth ) * _height * _rowSize );
            }
        }